

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Zuker.cpp
# Opt level: O0

void __thiscall Zuker::get_rna_cai(Zuker *this,string *rna)

{
  value_type vVar1;
  reference pvVar2;
  reference pvVar3;
  value_type *pvVar4;
  ulong in_RSI;
  long in_RDI;
  int idx_5;
  int idx_4;
  int idx_3;
  int idx_2;
  int idx_1;
  int idx;
  int x;
  int p;
  int i;
  int local_34;
  int local_30;
  int local_2c;
  int local_28;
  int local_24;
  int local_20;
  int in_stack_ffffffffffffffe4;
  value_type in_stack_ffffffffffffffe8;
  int iVar5;
  
  iVar5 = 0;
  while (SBORROW4(iVar5,*(int *)(in_RDI + 0x2b8) * 3) != iVar5 + *(int *)(in_RDI + 0x2b8) * -3 < 0)
  {
    pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x1f8),(long)iVar5);
    if (*pvVar2 == -1) {
      if (iVar5 % 3 == 0) {
        pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x1f8),(long)(iVar5 + 1))
        ;
        if ((*pvVar2 == -1) &&
           (pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                               ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x1f8),
                                (long)(iVar5 + 2)), *pvVar2 == -1)) {
          pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                             ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x1c8),
                              (long)(iVar5 / 3));
          in_stack_ffffffffffffffe8 = *pvVar2;
          pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                             ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x270),
                              (long)(iVar5 / 3));
          in_stack_ffffffffffffffe4 = *pvVar2;
          if (in_stack_ffffffffffffffe4 == -1) {
            in_stack_ffffffffffffffe4 = max_cai_pos[in_stack_ffffffffffffffe8];
          }
          pvVar3 = std::vector<char,_std::allocator<char>_>::operator[]
                             (&to_char,(long)nucleotides[in_stack_ffffffffffffffe8]
                                             [in_stack_ffffffffffffffe4][0]);
          vVar1 = *pvVar3;
          pvVar4 = (value_type *)std::__cxx11::string::operator[](in_RSI);
          *pvVar4 = vVar1;
          pvVar3 = std::vector<char,_std::allocator<char>_>::operator[]
                             (&to_char,(long)nucleotides[in_stack_ffffffffffffffe8]
                                             [in_stack_ffffffffffffffe4][1]);
          vVar1 = *pvVar3;
          pvVar4 = (value_type *)std::__cxx11::string::operator[](in_RSI);
          *pvVar4 = vVar1;
          pvVar3 = std::vector<char,_std::allocator<char>_>::operator[]
                             (&to_char,(long)nucleotides[in_stack_ffffffffffffffe8]
                                             [in_stack_ffffffffffffffe4][2]);
          vVar1 = *pvVar3;
          pvVar4 = (value_type *)std::__cxx11::string::operator[](in_RSI);
          *pvVar4 = vVar1;
        }
        else {
          pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                             ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x1f8),
                              (long)(iVar5 + 1));
          if (*pvVar2 == -1) {
            pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                               ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x270),
                                (long)(iVar5 / 3));
            local_20 = *pvVar2;
            if (local_20 == -1) {
              local_20 = fill_rna((Zuker *)CONCAT44(iVar5,in_stack_ffffffffffffffe8),
                                  in_stack_ffffffffffffffe4);
            }
            pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                               ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x1f8),
                                (long)(iVar5 + 2));
            pvVar3 = std::vector<char,_std::allocator<char>_>::operator[](&to_char,(long)*pvVar2);
            vVar1 = *pvVar3;
            pvVar4 = (value_type *)std::__cxx11::string::operator[](in_RSI);
            *pvVar4 = vVar1;
            pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                               ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x1c8),
                                (long)(iVar5 / 3));
            pvVar3 = std::vector<char,_std::allocator<char>_>::operator[]
                               (&to_char,(long)nucleotides[*pvVar2][local_20][0]);
            vVar1 = *pvVar3;
            pvVar4 = (value_type *)std::__cxx11::string::operator[](in_RSI);
            *pvVar4 = vVar1;
            pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                               ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x1c8),
                                (long)(iVar5 / 3));
            pvVar3 = std::vector<char,_std::allocator<char>_>::operator[]
                               (&to_char,(long)nucleotides[*pvVar2][local_20][1]);
            vVar1 = *pvVar3;
            pvVar4 = (value_type *)std::__cxx11::string::operator[](in_RSI);
            *pvVar4 = vVar1;
          }
          else {
            pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                               ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x1f8),
                                (long)(iVar5 + 2));
            if (*pvVar2 == -1) {
              pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                                 ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x270),
                                  (long)(iVar5 / 3));
              local_24 = *pvVar2;
              if (local_24 == -1) {
                local_24 = fill_rna((Zuker *)CONCAT44(iVar5,in_stack_ffffffffffffffe8),
                                    in_stack_ffffffffffffffe4);
              }
              pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                                 ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x1f8),
                                  (long)(iVar5 + 1));
              pvVar3 = std::vector<char,_std::allocator<char>_>::operator[](&to_char,(long)*pvVar2);
              vVar1 = *pvVar3;
              pvVar4 = (value_type *)std::__cxx11::string::operator[](in_RSI);
              *pvVar4 = vVar1;
              pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                                 ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x1c8),
                                  (long)(iVar5 / 3));
              pvVar3 = std::vector<char,_std::allocator<char>_>::operator[]
                                 (&to_char,(long)nucleotides[*pvVar2][local_24][0]);
              vVar1 = *pvVar3;
              pvVar4 = (value_type *)std::__cxx11::string::operator[](in_RSI);
              *pvVar4 = vVar1;
              pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                                 ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x1c8),
                                  (long)(iVar5 / 3));
              pvVar3 = std::vector<char,_std::allocator<char>_>::operator[]
                                 (&to_char,(long)nucleotides[*pvVar2][local_24][2]);
              vVar1 = *pvVar3;
              pvVar4 = (value_type *)std::__cxx11::string::operator[](in_RSI);
              *pvVar4 = vVar1;
            }
            else {
              pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                                 ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x270),
                                  (long)(iVar5 / 3));
              local_28 = *pvVar2;
              if (local_28 == -1) {
                local_28 = fill_rna((Zuker *)CONCAT44(iVar5,in_stack_ffffffffffffffe8),
                                    in_stack_ffffffffffffffe4);
              }
              pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                                 ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x1f8),
                                  (long)(iVar5 + 1));
              pvVar3 = std::vector<char,_std::allocator<char>_>::operator[](&to_char,(long)*pvVar2);
              vVar1 = *pvVar3;
              pvVar4 = (value_type *)std::__cxx11::string::operator[](in_RSI);
              *pvVar4 = vVar1;
              pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                                 ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x1f8),
                                  (long)(iVar5 + 2));
              pvVar3 = std::vector<char,_std::allocator<char>_>::operator[](&to_char,(long)*pvVar2);
              vVar1 = *pvVar3;
              pvVar4 = (value_type *)std::__cxx11::string::operator[](in_RSI);
              *pvVar4 = vVar1;
              pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                                 ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x1c8),
                                  (long)(iVar5 / 3));
              pvVar3 = std::vector<char,_std::allocator<char>_>::operator[]
                                 (&to_char,(long)nucleotides[*pvVar2][local_28][0]);
              vVar1 = *pvVar3;
              pvVar4 = (value_type *)std::__cxx11::string::operator[](in_RSI);
              *pvVar4 = vVar1;
            }
          }
        }
        iVar5 = iVar5 + 3;
      }
      if (iVar5 % 3 == 1) {
        pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x1f8),(long)(iVar5 + 1))
        ;
        if (*pvVar2 == -1) {
          pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                             ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x270),
                              (long)(iVar5 / 3));
          local_2c = *pvVar2;
          if (local_2c == -1) {
            local_2c = fill_rna((Zuker *)CONCAT44(iVar5,in_stack_ffffffffffffffe8),
                                in_stack_ffffffffffffffe4);
          }
          pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                             ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x1c8),
                              (long)(iVar5 / 3));
          pvVar3 = std::vector<char,_std::allocator<char>_>::operator[]
                             (&to_char,(long)nucleotides[*pvVar2][local_2c][1]);
          vVar1 = *pvVar3;
          pvVar4 = (value_type *)std::__cxx11::string::operator[](in_RSI);
          *pvVar4 = vVar1;
          pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                             ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x1c8),
                              (long)(iVar5 / 3));
          pvVar3 = std::vector<char,_std::allocator<char>_>::operator[]
                             (&to_char,(long)nucleotides[*pvVar2][local_2c][2]);
          vVar1 = *pvVar3;
          pvVar4 = (value_type *)std::__cxx11::string::operator[](in_RSI);
          *pvVar4 = vVar1;
        }
        else {
          pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                             ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x270),
                              (long)(iVar5 / 3));
          local_30 = *pvVar2;
          if (local_30 == -1) {
            local_30 = fill_rna((Zuker *)CONCAT44(iVar5,in_stack_ffffffffffffffe8),
                                in_stack_ffffffffffffffe4);
          }
          pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                             ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x1f8),
                              (long)(iVar5 + 1));
          pvVar3 = std::vector<char,_std::allocator<char>_>::operator[](&to_char,(long)*pvVar2);
          vVar1 = *pvVar3;
          pvVar4 = (value_type *)std::__cxx11::string::operator[](in_RSI);
          *pvVar4 = vVar1;
          pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                             ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x1c8),
                              (long)(iVar5 / 3));
          pvVar3 = std::vector<char,_std::allocator<char>_>::operator[]
                             (&to_char,(long)nucleotides[*pvVar2][local_30][1]);
          vVar1 = *pvVar3;
          pvVar4 = (value_type *)std::__cxx11::string::operator[](in_RSI);
          *pvVar4 = vVar1;
        }
        iVar5 = iVar5 + 2;
      }
      if (iVar5 % 3 == 2) {
        pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x270),(long)(iVar5 / 3))
        ;
        local_34 = *pvVar2;
        if (local_34 == -1) {
          local_34 = fill_rna((Zuker *)CONCAT44(iVar5,in_stack_ffffffffffffffe8),
                              in_stack_ffffffffffffffe4);
        }
        pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x1c8),(long)(iVar5 / 3))
        ;
        pvVar3 = std::vector<char,_std::allocator<char>_>::operator[]
                           (&to_char,(long)nucleotides[*pvVar2][local_34][2]);
        vVar1 = *pvVar3;
        pvVar4 = (value_type *)std::__cxx11::string::operator[](in_RSI);
        *pvVar4 = vVar1;
        iVar5 = iVar5 + 1;
      }
    }
    else {
      pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x1f8),(long)iVar5);
      pvVar3 = std::vector<char,_std::allocator<char>_>::operator[](&to_char,(long)*pvVar2);
      vVar1 = *pvVar3;
      pvVar4 = (value_type *)std::__cxx11::string::operator[](in_RSI);
      *pvVar4 = vVar1;
      iVar5 = iVar5 + 1;
    }
  }
  return;
}

Assistant:

void Zuker::get_rna_cai(string & rna) {


    int i = 0;
    while (i < 3*n) {
        if (nucle_seq[i] == -1) {
            if (i % 3 == 0) {
                if (nucle_seq[i+1] == -1 && nucle_seq[i+2] == -1) {
                    int p = protein[i/3];
                    int x = codon_selection[i/3];

                    if (x == -1)
                        x = max_cai_pos[p];
                    rna[i] = to_char[nucleotides[p][x][0]];
                    rna[i+1] = to_char[nucleotides[p][x][1]];
                    rna[i+2] = to_char[nucleotides[p][x][2]];
                    i = i+3;
                }
                else if (nucle_seq[i+1] == -1) {

                    int idx = codon_selection[i/3];
                    if (idx == -1)
                        idx = fill_rna(i);
                    rna[i+2] = to_char[nucle_seq[i+2]];
                    rna[i] = to_char[nucleotides[protein[i/3]][idx][0]];
                    rna[i+1] = to_char[nucleotides[protein[i/3]][idx][1]];

                    i = i+3;
                }
                else if (nucle_seq[i+2] == -1) {
                    int idx = codon_selection[i/3];
                    if (idx == -1)
                        idx = fill_rna(i);
                    rna[i+1] = to_char[nucle_seq[i+1]];
                    rna[i] = to_char[nucleotides[protein[i/3]][idx][0]];
                    rna[i+2] = to_char[nucleotides[protein[i/3]][idx][2]];

                    i = i+3;
                }
                else {
                    int idx = codon_selection[i/3];
                    if (idx == -1)
                        idx = fill_rna(i);
                    rna[i+1] = to_char[nucle_seq[i+1]];
                    rna[i+2] = to_char[nucle_seq[i+2]];
                    rna[i] = to_char[nucleotides[protein[i/3]][idx][0]];

                    i = i+3;
                }
            }
            if (i % 3 == 1) {
                if (nucle_seq[i+1] == -1) {

                    int idx = codon_selection[i/3];
                    if (idx == -1)
                        idx = fill_rna(i);
                    rna[i] = to_char[nucleotides[protein[i/3]][idx][1]];
                    rna[i+1] = to_char[nucleotides[protein[i/3]][idx][2]];


                    i = i+2;
                } else {
                    int idx = codon_selection[i/3];
                    if (idx == -1)
                        idx = fill_rna(i);
                    rna[i+1] = to_char[nucle_seq[i+1]];
                    rna[i] = to_char[nucleotides[protein[i/3]][idx][1]];

                    i = i+2;
                }
            }
            if (i % 3 == 2) {

                int idx = codon_selection[i/3];
                if (idx == -1)
                    idx = fill_rna(i);
                rna[i] = to_char[nucleotides[protein[i/3]][idx][2]];

                i++;
            }
        }
        else {
            rna[i] = to_char[nucle_seq[i]];
            i++;
        }
    }
}